

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O2

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  uv_tcp_t *tcp;
  char *pcVar2;
  undefined8 uStack_20;
  
  if (status == 0) {
    tcp = (uv_tcp_t *)malloc(0xf8);
    if (tcp == (uv_tcp_t *)0x0) {
      pcVar2 = "handle != NULL";
      uStack_20 = 0x2f;
    }
    else {
      iVar1 = uv_tcp_init_ex(server->loop,tcp,2);
      if (iVar1 == 0) {
        iVar1 = uv_accept(server,(uv_stream_t *)tcp);
        if (iVar1 == -0x10) {
          uv_close((uv_handle_t *)server,(uv_close_cb)0x0);
          uv_close((uv_handle_t *)tcp,free);
          return;
        }
        pcVar2 = "r == UV_EBUSY";
        uStack_20 = 0x35;
      }
      else {
        pcVar2 = "r == 0";
        uStack_20 = 0x32;
      }
    }
  }
  else {
    pcVar2 = "status == 0";
    uStack_20 = 0x2c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_tcp_t* handle;
  int r;

  ASSERT(status == 0);

  handle = malloc(sizeof(*handle));
  ASSERT(handle != NULL);

  r = uv_tcp_init_ex(server->loop, handle, AF_INET);
  ASSERT(r == 0);

  r = uv_accept(server, (uv_stream_t*)handle);
  ASSERT(r == UV_EBUSY);

  uv_close((uv_handle_t*) server, NULL);
  uv_close((uv_handle_t*) handle, (uv_close_cb)free);
}